

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.hpp
# Opt level: O0

void __thiscall
pstore::details::descriptor<pstore::details::posix_descriptor_traits>::reset
          (descriptor<pstore::details::posix_descriptor_traits> *this,value_type r)

{
  bool bVar1;
  value_type r_local;
  descriptor<pstore::details::posix_descriptor_traits> *this_local;
  
  bVar1 = valid(this);
  if (bVar1) {
    posix_descriptor_traits::close(this->fd_);
  }
  this->fd_ = r;
  return;
}

Assistant:

void reset (value_type r = invalid) noexcept {
                if (valid ()) {
                    traits_.close (fd_);
                }
                fd_ = r;
            }